

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hand.cpp
# Opt level: O0

void __thiscall
Hand::getFingers(Hand *this,vector<ShortFinger,_std::allocator<ShortFinger>_> *lastFingers)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  size_type sVar4;
  undefined1 local_208 [8];
  Finger nf;
  Finger local_1c0;
  __normal_iterator<Finger_*,_std::vector<Finger,_std::allocator<Finger>_>_> local_180;
  __normal_iterator<Finger_*,_std::vector<Finger,_std::allocator<Finger>_>_> local_178;
  __normal_iterator<Finger_*,_std::vector<Finger,_std::allocator<Finger>_>_> local_170;
  __normal_iterator<Finger_*,_std::vector<Finger,_std::allocator<Finger>_>_> fnd;
  Finger *f_1;
  iterator __end3;
  iterator __begin3;
  vector<Finger,_std::allocator<Finger>_> *__range3;
  undefined1 local_130 [8];
  Finger f;
  Vec4i *v;
  iterator __end1;
  iterator __begin1;
  vector<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_> *__range1;
  _InputArray local_b8;
  _InputArray local_a0;
  _OutputArray local_88;
  _InputArray local_70;
  _OutputArray local_48;
  _InputArray local_30;
  vector<ShortFinger,_std::allocator<ShortFinger>_> *local_18;
  vector<ShortFinger,_std::allocator<ShortFinger>_> *lastFingers_local;
  Hand *this_local;
  
  local_18 = lastFingers;
  lastFingers_local = (vector<ShortFinger,_std::allocator<ShortFinger>_> *)this;
  bVar1 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::empty(&this->contour);
  if (bVar1) {
    this->ok = false;
  }
  else {
    cv::_InputArray::_InputArray<cv::Point_<int>>(&local_30,&this->contour);
    cv::_OutputArray::_OutputArray<cv::Point_<int>>(&local_48,&this->hull);
    cv::convexHull(&local_30,&local_48,false,true);
    cv::_OutputArray::~_OutputArray(&local_48);
    cv::_InputArray::~_InputArray(&local_30);
    cv::_InputArray::_InputArray<cv::Point_<int>>(&local_70,&this->contour);
    cv::_OutputArray::_OutputArray<int>(&local_88,&this->hullI);
    cv::convexHull(&local_70,&local_88,false,true);
    cv::_OutputArray::~_OutputArray(&local_88);
    cv::_InputArray::~_InputArray(&local_70);
    cv::_InputArray::_InputArray<cv::Point_<int>>(&local_a0,&this->contour);
    cv::_InputArray::_InputArray<int>(&local_b8,&this->hullI);
    cv::_OutputArray::_OutputArray<cv::Vec<int,4>>((_OutputArray *)&__range1,&this->defects);
    cv::convexityDefects(&local_a0,&local_b8,(_OutputArray *)&__range1);
    cv::_OutputArray::~_OutputArray((_OutputArray *)&__range1);
    cv::_InputArray::~_InputArray(&local_b8);
    cv::_InputArray::~_InputArray(&local_a0);
    __end1 = std::vector<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>::begin(&this->defects);
    v = (Vec4i *)std::vector<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>::end
                           (&this->defects);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<cv::Vec<int,_4>_*,_std::vector<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>_>
                                       *)&v), bVar1) {
      f.boundingBox._8_8_ =
           __gnu_cxx::
           __normal_iterator<cv::Vec<int,_4>_*,_std::vector<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>_>
           ::operator*(&__end1);
      Finger::Finger((Finger *)local_130,(Vec4i *)f.boundingBox._8_8_,&this->contour,&this->border,
                     this->maxAngle,(bool)(this->shouldCheckAngles & 1),true,-1);
      if ((f.maxAngle._0_1_ & 1) != 0) {
        std::vector<Finger,_std::allocator<Finger>_>::push_back
                  (&this->fingers,(value_type *)local_130);
      }
      __gnu_cxx::
      __normal_iterator<cv::Vec<int,_4>_*,_std::vector<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>_>
      ::operator++(&__end1);
    }
    iVar2 = std::vector<Finger,_std::allocator<Finger>_>::begin(&this->fingers);
    iVar3 = std::vector<Finger,_std::allocator<Finger>_>::end(&this->fingers);
    std::
    sort<__gnu_cxx::__normal_iterator<Finger*,std::vector<Finger,std::allocator<Finger>>>,Hand::getFingers(std::vector<ShortFinger,std::allocator<ShortFinger>>const&)::__0>
              (iVar2._M_current,iVar3._M_current);
    removeCloseFingertips(this);
    getCenter(this);
    getFingersIndexes(this,local_18);
    if ((this->maxFingers != -1) &&
       (sVar4 = std::vector<Finger,_std::allocator<Finger>_>::size(&this->fingers),
       (ulong)(long)this->maxFingers < sVar4)) {
      std::vector<Finger,_std::allocator<Finger>_>::resize(&this->fingers,(long)this->maxFingers);
    }
    if ((((this->shouldGetLast & 1U) != 0) && (this->maxFingers != -1)) &&
       (sVar4 = std::vector<Finger,_std::allocator<Finger>_>::size(&this->fingers),
       sVar4 < (ulong)(long)this->maxFingers)) {
      __end3 = std::vector<Finger,_std::allocator<Finger>_>::begin(&this->fingers);
      f_1 = (Finger *)std::vector<Finger,_std::allocator<Finger>_>::end(&this->fingers);
      while ((bVar1 = __gnu_cxx::operator!=
                                (&__end3,(__normal_iterator<Finger_*,_std::vector<Finger,_std::allocator<Finger>_>_>
                                          *)&f_1), bVar1 &&
             ((fnd._M_current =
                    __gnu_cxx::
                    __normal_iterator<Finger_*,_std::vector<Finger,_std::allocator<Finger>_>_>::
                    operator*(&__end3), this->maxFingers == -1 ||
              (sVar4 = std::vector<Finger,_std::allocator<Finger>_>::size(&this->fingers),
              sVar4 < (ulong)(long)this->maxFingers))))) {
        local_178._M_current =
             (Finger *)std::vector<Finger,_std::allocator<Finger>_>::begin(&this->fingers);
        local_180._M_current =
             (Finger *)std::vector<Finger,_std::allocator<Finger>_>::end(&this->fingers);
        Finger::Finger(&local_1c0,fnd._M_current);
        local_170 = std::
                    find_if<__gnu_cxx::__normal_iterator<Finger*,std::vector<Finger,std::allocator<Finger>>>,Hand::getFingers(std::vector<ShortFinger,std::allocator<ShortFinger>>const&)::__1>
                              (local_178,local_180,&local_1c0);
        nf.boundingBox._8_8_ = std::vector<Finger,_std::allocator<Finger>_>::end(&this->fingers);
        bVar1 = __gnu_cxx::operator!=
                          (&local_170,
                           (__normal_iterator<Finger_*,_std::vector<Finger,_std::allocator<Finger>_>_>
                            *)&nf.boundingBox.width);
        if (!bVar1) {
          Finger::Finger((Finger *)local_208,fnd._M_current);
          cv::Point_<int>::operator=((Point_<int> *)local_208,&(fnd._M_current)->ptEnd);
          cv::Point_<int>::operator=(&nf.ptStart,&(fnd._M_current)->ptStart);
          nf.minDepth = -1;
          std::vector<Finger,std::allocator<Finger>>::emplace_back<Finger&>
                    ((vector<Finger,std::allocator<Finger>> *)&this->fingers,(Finger *)local_208);
        }
        __gnu_cxx::__normal_iterator<Finger_*,_std::vector<Finger,_std::allocator<Finger>_>_>::
        operator++(&__end3);
      }
    }
  }
  return;
}

Assistant:

void Hand::getFingers(const vector<ShortFinger> &lastFingers) {
    if (contour.empty()) {
        ok = false;
        return;
    }
    convexHull(contour, hull, false);
    convexHull(contour, hullI, false);
    convexityDefects(contour, hullI, defects);

    for (const Vec4i &v : defects) {
        Finger f(v, contour, border, maxAngle, shouldCheckAngles);
        if (f.ok)
            fingers.push_back(f);
    }
    sort(fingers.begin(), fingers.end(), [](const Finger &a, const Finger &b) {
        return a.ptStart.y < b.ptStart.y;
    });
    removeCloseFingertips();
    getCenter();
    getFingersIndexes(lastFingers);
    if (maxFingers != -1 && fingers.size() > maxFingers)
        fingers.resize(maxFingers);

    if (shouldGetLast) {
        if (maxFingers != -1 && fingers.size() < maxFingers) {
            for (const Finger &f : fingers) {
                if (maxFingers != -1 && fingers.size() >= maxFingers)
                    break;
                auto fnd = find_if(fingers.begin(), fingers.end(), [f](const Finger &b) {
                    return getDist(f.ptEnd, b.ptStart) <= 50;
                });
                if (fnd != fingers.end())
                    continue;

                Finger nf = f;
                nf.ptStart = f.ptEnd;
                nf.ptEnd = f.ptStart;
                nf.index = -1;
                fingers.emplace_back(nf);
            }
        }
    }
}